

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O1

void evutil_adjust_hints_for_addrconfig_(addrinfo *hints)

{
  int iVar1;
  int iVar2;
  undefined8 *puVar3;
  socklen_t sin_out_len;
  sockaddr_in sin_out;
  sockaddr_in6 sin6;
  sockaddr_in6 sin6_out;
  sockaddr_in sin;
  socklen_t local_80 [2];
  sockaddr local_78;
  undefined8 *local_68;
  char acStack_60 [24];
  sockaddr local_48;
  undefined4 uStack_38;
  undefined8 uStack_34;
  sockaddr local_28;
  
  if (((hints->ai_flags & 0x20) != 0) && (hints->ai_family == 0)) {
    local_80[1] = 0x10;
    local_80[0] = 0x1c;
    if (have_checked_interfaces == '\0') {
      have_checked_interfaces = '\x01';
      local_68 = (undefined8 *)0x0;
      iVar1 = getifaddrs();
      puVar3 = local_68;
      if (iVar1 < 0) {
        event_warn("Unable to call getifaddrs()");
      }
      else {
        for (; puVar3 != (undefined8 *)0x0; puVar3 = (undefined8 *)*puVar3) {
          if ((sockaddr *)puVar3[3] != (sockaddr *)0x0) {
            evutil_found_ifaddr((sockaddr *)puVar3[3]);
          }
        }
        freeifaddrs(local_68);
      }
      if (iVar1 < 0) {
        local_28.sa_data[6] = '\0';
        local_28.sa_data[7] = '\0';
        local_28.sa_data[8] = '\0';
        local_28.sa_data[9] = '\0';
        local_28.sa_data[10] = '\0';
        local_28.sa_data[0xb] = '\0';
        local_28.sa_data[0xc] = '\0';
        local_28.sa_data[0xd] = '\0';
        local_28.sa_family = 2;
        local_28.sa_data[0] = '\0';
        local_28.sa_data[1] = '5';
        local_28.sa_data[2] = '\0';
        local_28.sa_data[3] = '\0';
        local_28.sa_data[4] = '\0';
        local_28.sa_data[5] = '\0';
        iVar1 = evutil_inet_pton(2,"18.244.0.188",local_28.sa_data + 2);
        if (iVar1 == 0) {
          evutil_adjust_hints_for_addrconfig__cold_2();
LAB_001e61c1:
          evutil_adjust_hints_for_addrconfig__cold_1();
        }
        acStack_60[0] = '\0';
        acStack_60[1] = '\0';
        acStack_60[2] = '\0';
        acStack_60[3] = '\0';
        acStack_60[4] = '\0';
        acStack_60[5] = '\0';
        acStack_60[6] = '\0';
        acStack_60[7] = '\0';
        acStack_60[8] = '\0';
        acStack_60[9] = '\0';
        acStack_60[10] = '\0';
        acStack_60[0xb] = '\0';
        acStack_60[0xc] = '\0';
        acStack_60[0xd] = '\0';
        acStack_60[0xe] = '\0';
        acStack_60[0xf] = '\0';
        acStack_60[0x10] = '\0';
        acStack_60[0x11] = '\0';
        acStack_60[0x12] = '\0';
        acStack_60[0x13] = '\0';
        local_68 = (undefined8 *)0x3500000a;
        iVar1 = evutil_inet_pton(10,"2001:4860:b002::68",acStack_60);
        if (iVar1 == 0) goto LAB_001e61c1;
        local_78.sa_family = 0;
        local_78.sa_data[0] = '\0';
        local_78.sa_data[1] = '\0';
        local_78.sa_data[2] = '\0';
        local_78.sa_data[3] = '\0';
        local_78.sa_data[4] = '\0';
        local_78.sa_data[5] = '\0';
        local_78.sa_data[6] = '\0';
        local_78.sa_data[7] = '\0';
        local_78.sa_data[8] = '\0';
        local_78.sa_data[9] = '\0';
        local_78.sa_data[10] = '\0';
        local_78.sa_data[0xb] = '\0';
        local_78.sa_data[0xc] = '\0';
        local_78.sa_data[0xd] = '\0';
        local_48.sa_family = 0;
        local_48.sa_data[0] = '\0';
        local_48.sa_data[1] = '\0';
        local_48.sa_data[2] = '\0';
        local_48.sa_data[3] = '\0';
        local_48.sa_data[4] = '\0';
        local_48.sa_data[5] = '\0';
        local_48.sa_data[6] = '\0';
        local_48.sa_data[7] = '\0';
        local_48.sa_data[8] = '\0';
        local_48.sa_data[9] = '\0';
        local_48.sa_data[10] = '\0';
        local_48.sa_data[0xb] = '\0';
        local_48.sa_data[0xc] = '\0';
        local_48.sa_data[0xd] = '\0';
        uStack_38 = 0;
        uStack_34 = 0;
        iVar1 = socket(2,2,0x11);
        if (-1 < iVar1) {
          iVar2 = connect(iVar1,&local_28,0x10);
          if ((iVar2 == 0) && (iVar2 = getsockname(iVar1,&local_78,local_80 + 1), iVar2 == 0)) {
            evutil_found_ifaddr((sockaddr *)&local_78);
          }
          close(iVar1);
        }
        iVar1 = socket(10,2,0x11);
        if (-1 < iVar1) {
          iVar2 = connect(iVar1,(sockaddr *)&local_68,0x1c);
          if ((iVar2 == 0) && (iVar2 = getsockname(iVar1,&local_48,local_80), iVar2 == 0)) {
            evutil_found_ifaddr((sockaddr *)&local_48);
          }
          close(iVar1);
        }
      }
    }
    iVar1 = 2;
    if ((((had_ipv4_address ^ 1 | had_ipv6_address) & 1) == 0) ||
       (iVar1 = 10, ((had_ipv4_address ^ 1) & had_ipv6_address & 1) != 0)) {
      hints->ai_family = iVar1;
    }
  }
  return;
}

Assistant:

void
evutil_adjust_hints_for_addrconfig_(struct evutil_addrinfo *hints)
{
	if (!(hints->ai_flags & EVUTIL_AI_ADDRCONFIG))
		return;
	if (hints->ai_family != PF_UNSPEC)
		return;
	evutil_check_interfaces();
	if (had_ipv4_address && !had_ipv6_address) {
		hints->ai_family = PF_INET;
	} else if (!had_ipv4_address && had_ipv6_address) {
		hints->ai_family = PF_INET6;
	}
}